

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryBase.cpp
# Opt level: O3

void Diligent::VerifyEngineCreateInfo(EngineCreateInfo *EngineCI,GraphicsAdapterInfo *AdapterInfo)

{
  byte bVar1;
  long lVar2;
  long *plVar3;
  EngineCreateInfo *pEVar4;
  uint uVar5;
  ulong uVar6;
  byte *Args_3;
  uint local_8c;
  EngineCreateInfo *local_88;
  unsigned_long MaxImmediateContexts;
  array<unsigned_int,_16UL> QueueCount;
  
  if (*(int *)EngineCI != 0x3e808) {
    QueueCount._M_elems[0] = 0x3e808;
    LogError<true,char[26],int,char[50],int,char[2]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x2c,(char (*) [26])"Diligent Engine runtime (",(int *)&QueueCount,
               (char (*) [50])") is not compatible with the client API version (",(int *)EngineCI,
               (char (*) [2])0x73bf31);
  }
  local_88 = EngineCI + 0x18;
  uVar5 = *(uint *)(EngineCI + 0x18);
  if ((*(long *)(EngineCI + 0x10) == 0) == (uVar5 != 0)) {
    LogError<true,char[67]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x31,(char (*) [67])
                     "If NumImmediateContexts is not zero, pContextInfo must not be null");
    uVar5 = *(uint *)local_88;
  }
  pEVar4 = local_88;
  MaxImmediateContexts = 0x40;
  if (0x3f < uVar5) {
    LogError<true,char[23],unsigned_int,char[21],unsigned_long,char[1]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x39,(char (*) [23])"NumImmediateContexts (",(uint *)local_88,
               (char (*) [21])") must be less than ",&MaxImmediateContexts,(char (*) [1])0x6cf608);
    uVar5 = *(uint *)pEVar4;
  }
  QueueCount._M_elems[0xc] = 0;
  QueueCount._M_elems[0xd] = 0;
  QueueCount._M_elems[0xe] = 0;
  QueueCount._M_elems[0xf] = 0;
  QueueCount._M_elems[8] = 0;
  QueueCount._M_elems[9] = 0;
  QueueCount._M_elems[10] = 0;
  QueueCount._M_elems[0xb] = 0;
  QueueCount._M_elems[4] = 0;
  QueueCount._M_elems[5] = 0;
  QueueCount._M_elems[6] = 0;
  QueueCount._M_elems[7] = 0;
  QueueCount._M_elems[0] = 0;
  QueueCount._M_elems[1] = 0;
  QueueCount._M_elems[2] = 0;
  QueueCount._M_elems[3] = 0;
  local_8c = 0;
  if (uVar5 != 0) {
    do {
      lVar2 = *(long *)(EngineCI + 0x10);
      uVar6 = (ulong)local_8c;
      Args_3 = (byte *)(lVar2 + uVar6 * 0x10 + 8);
      bVar1 = *Args_3;
      if (AdapterInfo->NumQueues <= (uint)bVar1) {
        LogError<true,char[14],unsigned_int,char[12],unsigned_char,char[44],unsigned_int,char[3]>
                  (false,"VerifyEngineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
                   ,0x44,(char (*) [14])"pContextInfo[",&local_8c,(char (*) [12])"].QueueId (",
                   Args_3,(char (*) [44])") must be less than AdapterInfo.NumQueues (",
                   &AdapterInfo->NumQueues,(char (*) [3])0x75ce90);
        bVar1 = *Args_3;
      }
      uVar5 = QueueCount._M_elems[bVar1] + 1;
      QueueCount._M_elems[bVar1] = uVar5;
      if (AdapterInfo->Queues[bVar1].MaxDeviceContexts < uVar5) {
        LogError<true,char[14],unsigned_int,char[40],unsigned_char,char[39],unsigned_int,char[2]>
                  (false,"VerifyEngineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
                   ,0x4a,(char (*) [14])"pContextInfo[",&local_8c,
                   (char (*) [40])"]: the number of contexts with QueueId ",Args_3,
                   (char (*) [39])" exceeds the maximum available number ",
                   &AdapterInfo->Queues[bVar1].MaxDeviceContexts,(char (*) [2])0x75a69e);
      }
      if (3 < (byte)(*(char *)(lVar2 + uVar6 * 0x10 + 9) - 1U)) {
        LogError<true,char[23]>
                  (false,"VerifyEngineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
                   ,0x55,(char (*) [23])"Unknown queue priority");
      }
      local_8c = local_8c + 1;
    } while (local_8c < *(uint *)local_88);
  }
  plVar3 = *(long **)(EngineCI + 0x70);
  if (((plVar3 != (long *)0x0) && (plVar3[1] != 0)) && (*plVar3 == 0)) {
    LogError<true,char[85]>
              (false,"VerifyEngineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineFactoryBase.cpp"
               ,0x5d,(char (*) [85])
                     "pXRAttribs->GetInstanceProcAddr must not be null if pXRAttribs->Instance is not null"
              );
  }
  return;
}

Assistant:

void VerifyEngineCreateInfo(const EngineCreateInfo& EngineCI, const GraphicsAdapterInfo& AdapterInfo) noexcept(false)
{
    if (EngineCI.EngineAPIVersion != DILIGENT_API_VERSION)
    {
        LOG_ERROR_AND_THROW("Diligent Engine runtime (", DILIGENT_API_VERSION, ") is not compatible with the client API version (", EngineCI.EngineAPIVersion, ")");
    }

    if ((EngineCI.NumImmediateContexts > 0) != (EngineCI.pImmediateContextInfo != nullptr))
    {
        LOG_ERROR_AND_THROW("If NumImmediateContexts is not zero, pContextInfo must not be null");
    }

    constexpr auto MaxImmediateContexts = 8 * std::min(sizeof(decltype(BufferDesc::ImmediateContextMask)), sizeof(decltype(TextureDesc::ImmediateContextMask)));
    static_assert(MAX_COMMAND_QUEUES == MaxImmediateContexts, "Number of bits in MaxImmediateContexts must be equal to MAX_COMMAND_QUEUES");

    if (EngineCI.NumImmediateContexts >= MaxImmediateContexts)
    {
        LOG_ERROR_AND_THROW("NumImmediateContexts (", EngineCI.NumImmediateContexts, ") must be less than ", MaxImmediateContexts, "");
    }

    std::array<Uint32, DILIGENT_MAX_ADAPTER_QUEUES> QueueCount = {};
    for (Uint32 CtxInd = 0; CtxInd < EngineCI.NumImmediateContexts; ++CtxInd)
    {
        const auto& ContextInfo = EngineCI.pImmediateContextInfo[CtxInd];

        if (ContextInfo.QueueId >= AdapterInfo.NumQueues)
        {
            LOG_ERROR_AND_THROW("pContextInfo[", CtxInd, "].QueueId (", ContextInfo.QueueId, ") must be less than AdapterInfo.NumQueues (",
                                AdapterInfo.NumQueues, ").");
        }
        QueueCount[ContextInfo.QueueId] += 1;
        if (QueueCount[ContextInfo.QueueId] > AdapterInfo.Queues[ContextInfo.QueueId].MaxDeviceContexts)
        {
            LOG_ERROR_AND_THROW("pContextInfo[", CtxInd, "]: the number of contexts with QueueId ", ContextInfo.QueueId,
                                " exceeds the maximum available number ", AdapterInfo.Queues[ContextInfo.QueueId].MaxDeviceContexts, ".");
        }

        switch (ContextInfo.Priority)
        {
            case QUEUE_PRIORITY_LOW:
            case QUEUE_PRIORITY_MEDIUM:
            case QUEUE_PRIORITY_HIGH:
            case QUEUE_PRIORITY_REALTIME:
                break;
            default:
                LOG_ERROR_AND_THROW("Unknown queue priority");
        }
    }

    if (EngineCI.pXRAttribs != nullptr && EngineCI.pXRAttribs->Instance != 0)
    {
        if (EngineCI.pXRAttribs->GetInstanceProcAddr == nullptr)
        {
            LOG_ERROR_AND_THROW("pXRAttribs->GetInstanceProcAddr must not be null if pXRAttribs->Instance is not null");
        }
    }
}